

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uitercollationiterator.cpp
# Opt level: O0

int32_t __thiscall icu_63::FCDUIterCollationIterator::getOffset(FCDUIterCollationIterator *this)

{
  FCDUIterCollationIterator *this_local;
  
  if ((int)this->state < 2) {
    this_local._4_4_ =
         (*((this->super_UIterCollationIterator).iter)->getIndex)
                   ((this->super_UIterCollationIterator).iter,UITER_CURRENT);
  }
  else if (this->state == ITER_IN_FCD_SEGMENT) {
    this_local._4_4_ = this->pos;
  }
  else if (this->pos == 0) {
    this_local._4_4_ = this->start;
  }
  else {
    this_local._4_4_ = this->limit;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
FCDUIterCollationIterator::getOffset() const {
    if(state <= ITER_CHECK_BWD) {
        return iter.getIndex(&iter, UITER_CURRENT);
    } else if(state == ITER_IN_FCD_SEGMENT) {
        return pos;
    } else if(pos == 0) {
        return start;
    } else {
        return limit;
    }
}